

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

string * __thiscall
soul::TokenisedPathString::getParentPath_abi_cxx11_
          (string *__return_storage_ptr__,TokenisedPathString *this)

{
  size_t sVar1;
  string local_38;
  TokenisedPathString *local_18;
  TokenisedPathString *this_local;
  
  local_18 = this;
  this_local = (TokenisedPathString *)__return_storage_ptr__;
  sVar1 = ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::size(&this->sections);
  if (sVar1 < 2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    sVar1 = ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::size(&this->sections);
    ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::operator[]
              (&this->sections,sVar1 - 2);
    std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
    choc::text::trim(__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getParentPath() const
    {
        if (sections.size() <= 1)
            return {};

        return choc::text::trim (fullPath.substr (0, sections[sections.size() - 2].end));
    }